

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall
QCborStreamReaderPrivate::QCborStreamReaderPrivate(QCborStreamReaderPrivate *this,QIODevice *device)

{
  (this->lastError).c = NoError;
  this->bufferStart = 0;
  this->corrupt = false;
  (this->buffer).d.d = (Data *)0x0;
  (this->buffer).d.ptr = (char *)0x0;
  (this->buffer).d.size = 0;
  (this->containerStack).super_QList<CborValue>.d.d = (Data *)0x0;
  (this->containerStack).super_QList<CborValue>.d.ptr = (CborValue *)0x0;
  (this->containerStack).super_QList<CborValue>.d.size = 0;
  QByteArray::clear(&this->buffer);
  this->device = device;
  initDecoder(this);
  return;
}

Assistant:

QCborStreamReaderPrivate(QIODevice *device)
    {
        setDevice(device);
    }